

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 HashmapMergeSort(jx9_hashmap *pMap,ProcNodeCmp xCmp,void *pCmpData)

{
  jx9_hashmap_node *pjVar1;
  jx9_hashmap_node *pB;
  long lVar2;
  jx9_hashmap_node *a [32];
  
  SyZero(a,0x100);
  pB = pMap->pFirst;
LAB_00132619:
  do {
    if (pB == (jx9_hashmap_node *)0x0) {
      for (lVar2 = 1; lVar2 != 0x20; lVar2 = lVar2 + 1) {
        a[0] = HashmapNodeMerge(a[0],a[lVar2],xCmp,pCmpData);
      }
      a[0]->pNext = (jx9_hashmap_node *)0x0;
      pMap->pFirst = a[0];
      pMap->pCur = a[0];
      return (sxi32)a[0];
    }
    pjVar1 = pB->pPrev;
    pB->pPrev = (jx9_hashmap_node *)0x0;
    for (lVar2 = 0; lVar2 != 0x1f; lVar2 = lVar2 + 1) {
      if (a[lVar2] == (jx9_hashmap_node *)0x0) {
        a[lVar2] = pB;
        pB = pjVar1;
        goto LAB_00132619;
      }
      pB = HashmapNodeMerge(a[lVar2],pB,xCmp,pCmpData);
      a[lVar2] = (jx9_hashmap_node *)0x0;
    }
    a[0x1f] = HashmapNodeMerge(a[0x1f],pB,xCmp,pCmpData);
    pB = pjVar1;
  } while( true );
}

Assistant:

static sxi32 HashmapMergeSort(jx9_hashmap *pMap, ProcNodeCmp xCmp, void *pCmpData)
{
	jx9_hashmap_node *a[N_SORT_BUCKET], *p, *pIn;
	sxu32 i;
	SyZero(a, sizeof(a));
	/* Point to the first inserted entry */
	pIn = pMap->pFirst;
	while( pIn ){
		p = pIn;
		pIn = p->pPrev;
		p->pPrev = 0;
		for(i=0; i<N_SORT_BUCKET-1; i++){
			if( a[i]==0 ){
				a[i] = p;
				break;
			}else{
				p = HashmapNodeMerge(a[i], p, xCmp, pCmpData);
				a[i] = 0;
			}
		}
		if( i==N_SORT_BUCKET-1 ){
			/* To get here, there need to be 2^(N_SORT_BUCKET) elements in he input list.
			 * But that is impossible.
			 */
			a[i] = HashmapNodeMerge(a[i], p, xCmp, pCmpData);
		}
	}
	p = a[0];
	for(i=1; i<N_SORT_BUCKET; i++){
		p = HashmapNodeMerge(p, a[i], xCmp, pCmpData);
	}
	p->pNext = 0;
	/* Reflect the change */
	pMap->pFirst = p;
	/* Reset the loop cursor */
	pMap->pCur = pMap->pFirst;
	return SXRET_OK;
}